

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhileStatement.cpp
# Opt level: O0

void __thiscall
hdc::WhileStatement::WhileStatement
          (WhileStatement *this,Expression *expression,CompoundStatement *statements)

{
  CompoundStatement *statements_local;
  Expression *expression_local;
  WhileStatement *this_local;
  
  Statement::Statement(&this->super_Statement);
  (this->super_Statement).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_00221c38;
  this->expression = expression;
  this->statements = statements;
  ASTNode::setKind((ASTNode *)this,AST_WHILE);
  ASTNode::setParentNode((ASTNode *)expression,(ASTNode *)this);
  ASTNode::setParentNode((ASTNode *)statements,(ASTNode *)this);
  return;
}

Assistant:

WhileStatement::WhileStatement(Expression* expression, CompoundStatement* statements) {
    this->expression = expression;
    this->statements = statements;
    setKind(AST_WHILE);
    expression->setParentNode(this);
    statements->setParentNode(this);
}